

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O2

void __thiscall
Object::makePolygons4Render
          (Object *this,Vector2d *obs,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *polygons)

{
  pointer pEVar1;
  _Elt_pointer pMVar2;
  _Elt_pointer pMVar3;
  Edge *eg;
  pointer pEVar4;
  vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *this_00;
  Vector3d *p;
  _Elt_pointer __args;
  _Map_pointer ppMVar5;
  
  pEVar1 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pEVar4 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                super__Vector_impl_data._M_start; pEVar4 != pEVar1; pEVar4 = pEVar4 + 1) {
    if (pEVar4->valid != false) {
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::emplace_back<>(polygons);
      this_00 = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)
                ((polygons->
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1);
      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<double&,double&>
                (this_00,(double *)obs,
                 (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array + 1);
      __args = (pEVar4->
               super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ).
               super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pMVar3 = (pEVar4->
               super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ).
               super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppMVar5 = (pEVar4->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      pMVar2 = (pEVar4->
               super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ).
               super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (__args != pMVar2) {
        std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
        emplace_back<double_const&,double_const&>
                  (this_00,(double *)__args,
                   (__args->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array + 1);
        __args = __args + 1;
        if (__args == pMVar3) {
          __args = ppMVar5[1];
          ppMVar5 = ppMVar5 + 1;
          pMVar3 = __args + 0x15;
        }
      }
    }
  }
  return;
}

Assistant:

void Object::makePolygons4Render(Eigen::Vector2d obs, std::vector<std::vector<cv::Point>>& polygons) const{
    for (const Edge& eg: edges) {
        if (eg.valid == false) continue;
        polygons.emplace_back();
        std::vector<cv::Point>& back = polygons.back();
        back.emplace_back(obs.x(), obs.y());
        for (const Eigen::Vector3d& p: eg) {
            back.emplace_back(p.x(), p.y());
        }
    }
}